

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_stdlib.hpp
# Opt level: O1

ModulePtr chaiscript::Std_Lib::library(void)

{
  uint *m;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  pointer ppVar3;
  pointer __dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  ModulePtr MVar5;
  size_type __dnew;
  string local_a0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (in_RDI->m_typeinfos).
  super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppVar3 = (pointer)operator_new(0x88);
  (ppVar3->first).m_bare_type_info = (type_info *)0x100000001;
  (ppVar3->first).m_type_info = (type_info *)&PTR___Sp_counted_ptr_inplace_003fe7b0;
  m = &(ppVar3->first).m_flags;
  *(undefined8 *)&(ppVar3->first).m_flags = 0;
  (ppVar3->second)._M_dataplus._M_p = (pointer)0x0;
  (ppVar3->second)._M_string_length = 0;
  (ppVar3->second).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(ppVar3->second).field_2 + 8) = 0;
  ppVar3[1].first.m_type_info = (type_info *)0x0;
  ppVar3[1].first.m_bare_type_info = (type_info *)0x0;
  *(undefined8 *)&ppVar3[1].first.m_flags = 0;
  ppVar3[1].second._M_dataplus._M_p = (pointer)0x0;
  ppVar3[1].second._M_string_length = 0;
  ppVar3[1].second.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&ppVar3[1].second.field_2 + 8) = 0;
  ppVar3[2].first.m_type_info = (type_info *)0x0;
  ppVar3[2].first.m_bare_type_info = (type_info *)0x0;
  *(undefined8 *)&ppVar3[2].first.m_flags = 0;
  (in_RDI->m_typeinfos).
  super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  (in_RDI->m_typeinfos).
  super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)m;
  bootstrap::Bootstrap::bootstrap((Module *)m);
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Vector","");
  bootstrap::standard_library::
  vector_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (&local_a0,(Module *)m);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"string","");
  bootstrap::standard_library::string_type<std::__cxx11::string>(&local_a0,(Module *)m);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Map","");
  bootstrap::standard_library::
  map_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            (&local_a0,(Module *)m);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Pair","");
  bootstrap::standard_library::pair_type<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            (&local_a0,(Module *)m);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"future","");
  bootstrap::standard_library::future_type<std::future<chaiscript::Boxed_Value>>
            (&local_a0,(Module *)m);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::Std_Lib::library()::_lambda(std::function<chaiscript::Boxed_Value()>const&)_1_,false,false,false,true,std::future<chaiscript::Boxed_Value>,std::function<chaiscript::Boxed_Value()>const&>
            (&local_80,&local_a0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"async","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)(ppVar3->second).field_2._M_local_buf,&local_80,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_80.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  json_wrap::library((Module *)m);
  local_a0._M_dataplus._M_p = (pointer)0x2cb2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  __dest = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_70,(size_type *)&local_a0,0);
  _Var2._M_p = local_a0._M_dataplus._M_p;
  local_70.field_2._M_allocated_capacity = (size_type)local_a0._M_dataplus._M_p;
  local_70._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "\n\ndef lt(l, r) {\n  if (call_exists(`<`, l, r)) {\n    l < r\n  } else {\n    type_name(l) < type_name(r)\n  }\n}\n\n\ndef gt(l, r) {\n  if (call_exists(`>`, l, r)) {\n    l > r\n  } else {\n    type_name(l) > type_name(r)\n  }\n}\n\ndef eq(l, r) {\n  if (call_exists(`==`, l, r)) {\n    l == r\n  } else {\n    false\n  }\n}\n\ndef new(x) {\n  eval(type_name(x))();\n}\n\ndef clone(double x) {\n  double(x).clone_var_attrs(x)\n}\n\ndef clone(string x) {\n  string(x).clone_var_attrs(x)\n}\n\ndef clone(vector x) {\n  vector(x).clone_var_attrs(x)\n}\n\n\ndef clone(int x) {\n  int(x).clone_var_attrs(x)\n}\n\ndef clone(x) : function_exists(type_name(x)) && call_exists(eval(type_name(x)), x)\n{\n  eval(type_name(x))(x).clone_var_attrs(x);\n}\n\n\n# to_string for Pair()\ndef to_string(x) : call_exists(first, x) && call_exists(second, x) {\n  \"<\" + x.first.to_string() + \", \" + x.second.to_string() + \">\";\n}\n\n# to_string for containers\ndef to_string(x) : call_exists(range, x) && !x.is_type(\"string\"){\n  \"[\" + x.join(\", \") + \"]\";\n}\n\n# Prints to console with no carriage return\ndef puts(x) {\n  print_string(x.to_string());\n}\n\n# Prints to console with carriage return\ndef print(x) {\n  println_string(x.to_string());\n}\n\n# Returns the maximum value of two numbers\ndef max(a, b) {\n  if (a>b) {\n    a\n  } else {\n    b\n  }\n}\n\n# Returns the minimum value of two numbers\ndef min(a, b)\n{\n  if (a<b)\n  {\n    a\n  } else {\n    b\n  }\n}\n\n\n# Returns true if the value is odd\ndef odd(x)  {\n  if (x % 2 == 1)\n  {\n    true\n  } else {\n    false\n  }\n}\n\n\n# Returns true if the value is even\ndef even(x)\n{\n  if (x % 2 == 0)\n  {\n    true\n  } else {\n    false\n  }\n}\n\n\n# Inserts the third value at the position of the second value into the container of the first\n# while making a clone.\ndef insert_at(container, pos, x)\n{\n  container.insert_ref_at(pos, clone(x));\n}\n\n# Returns the reverse of the given container\ndef reverse(container) {\n  auto retval := new(container);\n  auto r := range(container);\n  while (!r.empty()) {\n    retval.push_back(r.back());\n    r.pop_back();\n  }\n  retval;\n}\n\n\ndef range(r) : call_exists(range_int..." /* TRUNCATED STRING LITERAL */
         ,0x2cb2);
  local_70._M_string_length = (size_type)_Var2._M_p;
  __dest[_Var2._M_p] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &ppVar3[1].second._M_string_length,&local_70);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1));
    _Var4._M_pi = extraout_RDX_00;
  }
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] static ModulePtr library() {
      auto lib = std::make_shared<Module>();
      bootstrap::Bootstrap::bootstrap(*lib);

      bootstrap::standard_library::vector_type<std::vector<Boxed_Value>>("Vector", *lib);
      bootstrap::standard_library::string_type<std::string>("string", *lib);
      bootstrap::standard_library::map_type<std::map<std::string, Boxed_Value>>("Map", *lib);
      bootstrap::standard_library::pair_type<std::pair<Boxed_Value, Boxed_Value>>("Pair", *lib);

#ifndef CHAISCRIPT_NO_THREADS
      bootstrap::standard_library::future_type<std::future<chaiscript::Boxed_Value>>("future", *lib);
      lib->add(chaiscript::fun(
                   [](const std::function<chaiscript::Boxed_Value()> &t_func) { return std::async(std::launch::async, t_func); }),
               "async");
#endif

      json_wrap::library(*lib);

      lib->eval(ChaiScript_Prelude::chaiscript_prelude() /*, "standard prelude"*/);

      return lib;
    }